

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query_result.cpp
# Opt level: O2

void __thiscall duckdb::QueryResult::~QueryResult(QueryResult *this)

{
  code *pcVar1;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

QueryResult::~QueryResult() {
}